

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O2

format crnlib::texture_file_types::determine_file_format(char *pFilename)

{
  bool bVar1;
  char *pcVar2;
  format fVar3;
  char **ppcVar4;
  uint i;
  long lVar5;
  dynamic_string ext;
  
  ext.m_buf_size = 0;
  ext.m_len = 0;
  ext.m_pStr = (char *)0x0;
  bVar1 = file_utils::split_path
                    (pFilename,(dynamic_string *)0x0,(dynamic_string *)0x0,(dynamic_string *)0x0,
                     &ext);
  fVar3 = cFormatInvalid;
  if (bVar1 && ext.m_len != 0) {
    pcVar2 = "";
    if (ext.m_pStr != (char *)0x0) {
      pcVar2 = ext.m_pStr;
    }
    if (*pcVar2 == '.') {
      dynamic_string::right(&ext,1);
    }
    ppcVar4 = get_extension::extensions;
    for (lVar5 = 0; lVar5 != 0x11; lVar5 = lVar5 + 1) {
      bVar1 = dynamic_string::operator==(&ext,*ppcVar4);
      if (bVar1) {
        fVar3 = (format)lVar5;
        break;
      }
      ppcVar4 = ppcVar4 + 1;
    }
  }
  dynamic_string::~dynamic_string(&ext);
  return fVar3;
}

Assistant:

texture_file_types::format texture_file_types::determine_file_format(const char* pFilename) {
  dynamic_string ext;
  if (!file_utils::split_path(pFilename, NULL, NULL, NULL, &ext))
    return cFormatInvalid;

  if (ext.is_empty())
    return cFormatInvalid;

  if (ext[0] == '.')
    ext.right(1);

  for (uint i = 0; i < cNumFileFormats; i++)
    if (ext == get_extension(static_cast<format>(i)))
      return static_cast<format>(i);

  return cFormatInvalid;
}